

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamical-system-simulator.cpp
# Opt level: O2

Vector __thiscall
stateObservation::DynamicalSystemSimulator::getMeasurement
          (DynamicalSystemSimulator *this,TimeIndex k)

{
  size_type sVar1;
  TimeIndex TVar2;
  DenseStorage<double,__1,__1,_1,_0> *other;
  TimeIndex in_RDX;
  Index extraout_RDX;
  Vector VVar3;
  
  sVar1 = std::
          deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)(k + 0x70));
  if ((sVar1 != 0) && (in_RDX <= *(long *)(k + 0x68))) {
    __assert_fail("(y_.size() == 0 || y_.getFirstIndex() < k) && \"ERROR: Only future measurements can be obtained\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/dynamical-system-simulator.cpp"
                  ,0x24,
                  "virtual Vector stateObservation::DynamicalSystemSimulator::getMeasurement(TimeIndex)"
                 );
  }
  TVar2 = IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::getNextIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          *)(k + 0x68));
  if (TVar2 < in_RDX) {
    (**(code **)(*(long *)k + 0x40))(k);
  }
  other = (DenseStorage<double,__1,__1,_1,_0> *)
          IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)(k + 0x68),in_RDX);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,other);
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector DynamicalSystemSimulator::getMeasurement(TimeIndex k)
{
  BOOST_ASSERT((y_.size() == 0 || y_.getFirstIndex() < k) && "ERROR: Only future measurements can be obtained");
  if(y_.getNextIndex() < k) simulateDynamicsTo(k);

  return y_[k];
}